

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5.c
# Opt level: O0

void proxy_socks5_process_queue(ProxyNegotiator *pn)

{
  BinarySink *pBVar1;
  Interactor *pIVar2;
  SeatPromptResult spr_00;
  SeatPromptResult spr_01;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  bufchain_sink *pbVar6;
  prompts_t *ppVar7;
  InteractionReadySeat iseat;
  strbuf *sb;
  char *pcVar8;
  ptrlen pVar9;
  ptrlen password;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  byte local_30d;
  byte local_30c;
  byte local_30b;
  byte local_309;
  char local_308 [3];
  uchar len;
  uchar data_4 [4];
  char hostname [512];
  char buf_1 [16];
  char local_ec [4];
  undefined1 auStack_e8 [4];
  char buf [4];
  strbuf *response;
  undefined1 auStack_a8 [2];
  uchar data_3 [2];
  uchar data_2 [2];
  uchar data_1 [2];
  undefined1 local_80 [8];
  SeatPromptResult spr;
  size_t i;
  undefined1 auStack_50 [5];
  _Bool found;
  uchar data [2];
  int *crLine;
  Socks5ProxyNegotiator *s;
  ProxyNegotiator *pn_local;
  
  pbVar6 = pn[-4].output;
  iVar4 = *(int *)&pbVar6->ch;
  if (iVar4 == 0) {
    BinarySink_put_byte(pn->output[0].binarysink_,'\x05');
    strbuf_clear((strbuf *)pn[-4].output[0].binarysink_[0].write);
    BinarySink_put_byte((BinarySink *)(pn[-4].output[0].binarysink_[0].write + 0x18),'\0');
    pBVar1 = pn[-1].output[0].binarysink_[0].binarysink_;
    pcVar8 = conf_get_str(pn->ps->conf,0x10);
    pVar9 = ptrlen_from_asciz(pcVar8);
    BinarySink_put_datapl(pBVar1 + 1,pVar9);
    pIVar2 = pn[-1].itr;
    pcVar8 = conf_get_str(pn->ps->conf,0x11);
    pVar9 = ptrlen_from_asciz(pcVar8);
    BinarySink_put_datapl((BinarySink *)(pIVar2 + 1),pVar9);
    if ((pn->itr != (Interactor *)0x0) ||
       (((pn[-1].output[0].binarysink_[0].binarysink_)->binarysink_ != (BinarySink *)0x0 &&
        ((pn[-1].itr)->last_to_talk != (Interactor *)0x0)))) {
      BinarySink_put_byte((BinarySink *)(pn[-4].output[0].binarysink_[0].write + 0x18),'\x03');
      BinarySink_put_byte((BinarySink *)(pn[-4].output[0].binarysink_[0].write + 0x18),'\x02');
    }
    BinarySink_put_byte(pn->output[0].binarysink_,
                        (uchar)*(undefined8 *)(pn[-4].output[0].binarysink_[0].write + 0x10));
    _auStack_50 = ptrlen_from_strbuf((strbuf *)pn[-4].output[0].binarysink_[0].write);
    BinarySink_put_datapl(pn->output[0].binarysink_,_auStack_50);
    *(undefined4 *)&pbVar6->ch = 0x77;
    return;
  }
  if (iVar4 == 0x77) {
    *(undefined4 *)&pbVar6->ch = 0x81;
LAB_0016a529:
    _Var3 = bufchain_try_fetch_consume(pn->input,(void *)((long)&i + 6),2);
    if (!_Var3) {
      return;
    }
    if (i._6_1_ != 5) {
      pcVar8 = dupprintf("SOCKS proxy returned unexpected reply version %d (expected %d)",
                         (ulong)i._6_1_,5);
      pn->error = pcVar8;
      *(undefined4 *)&pbVar6->ch = 0;
      return;
    }
    if (i._7_1_ == 0xff) {
      pcVar8 = dupstr("SOCKS server rejected every authentication method we offered");
      pn->error = pcVar8;
      *(undefined4 *)&pbVar6->ch = 0;
      return;
    }
    i._5_1_ = '\0';
    spr.errdata_u = 0;
    spr._28_4_ = 0;
    for (; (ulong)spr._24_8_ < *(ulong *)(pn[-4].output[0].binarysink_[0].write + 0x10);
        spr._24_8_ = spr._24_8_ + 1) {
      if (*(byte *)(*(long *)(pn[-4].output[0].binarysink_[0].write + 8) + spr._24_8_) == i._7_1_) {
        i._5_1_ = '\x01';
        break;
      }
    }
    if (i._5_1_ == '\0') {
      pcVar8 = socks5_auth_name(i._7_1_);
      pcVar8 = dupprintf("SOCKS server asked for auth method %d (%s), which we did not offer",
                         (ulong)i._7_1_,pcVar8);
      pn->error = pcVar8;
      *(undefined4 *)&pbVar6->ch = 0;
      return;
    }
    *(byte *)&pn[-4].output[0].binarysink_[0].writefmtv = i._7_1_;
    if (*(char *)&pn[-4].output[0].binarysink_[0].writefmtv == '\0') goto LAB_0016af1c;
    if ((pn->itr != (Interactor *)0x0) &&
       (((pn[-1].output[0].binarysink_[0].binarysink_)->binarysink_ == (BinarySink *)0x0 ||
        ((pn[-1].itr)->last_to_talk == (Interactor *)0x0)))) {
      ppVar7 = proxy_new_prompts(pn->ps);
      *(prompts_t **)&pn[-1].done = ppVar7;
      **(undefined1 **)&pn[-1].done = 1;
      *(undefined1 *)(*(long *)&pn[-1].done + 1) = 0;
      pcVar8 = dupstr("SOCKS proxy authentication");
      *(char **)(*(long *)&pn[-1].done + 8) = pcVar8;
      if ((pn[-1].output[0].binarysink_[0].binarysink_)->binarysink_ == (BinarySink *)0x0) {
        *(int *)&pn[-1].error = (int)*(undefined8 *)(*(long *)&pn[-1].done + 0x28);
        ppVar7 = *(prompts_t **)&pn[-1].done;
        pcVar8 = dupstr("Proxy username: ");
        add_prompt(ppVar7,pcVar8,true);
      }
      else {
        *(undefined4 *)&pn[-1].error = 0xffffffff;
      }
      if ((pn[-1].itr)->last_to_talk == (Interactor *)0x0) {
        *(int *)((long)&pn[-1].error + 4) = (int)*(undefined8 *)(*(long *)&pn[-1].done + 0x28);
        ppVar7 = *(prompts_t **)&pn[-1].done;
        pcVar8 = dupstr("Proxy password: ");
        add_prompt(ppVar7,pcVar8,false);
      }
      else {
        *(undefined4 *)((long)&pn[-1].error + 4) = 0xffffffff;
      }
      goto LAB_0016a7d5;
    }
LAB_0016a9bd:
    if (*(char *)&pn[-4].output[0].binarysink_[0].writefmtv != '\x02') {
      if (*(char *)&pn[-4].output[0].binarysink_[0].writefmtv == '\x03') {
        BinarySink_put_byte(pn->output[0].binarysink_,'\x01');
        BinarySink_put_byte(pn->output[0].binarysink_,'\x02');
        BinarySink_put_byte(pn->output[0].binarysink_,'\x11');
        BinarySink_put_byte(pn->output[0].binarysink_,'\x01');
        BinarySink_put_byte(pn->output[0].binarysink_,0x85);
        BinarySink_put_byte(pn->output[0].binarysink_,'\x02');
        _Var3 = BinarySink_put_pstring
                          (pn->output[0].binarysink_,
                           (char *)(pn[-1].output[0].binarysink_[0].binarysink_)->write);
        if (_Var3) goto LAB_0016ac2a;
        pcVar8 = dupstr("SOCKS 5 CHAP authentication cannot support usernames longer than 255 chars"
                       );
        pn->error = pcVar8;
        *(undefined4 *)&pbVar6->ch = 0;
        return;
      }
      __assert_fail("false && \"bad auth method in SOCKS 5 negotiation\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/socks5.c"
                    ,0x177,"void proxy_socks5_process_queue(ProxyNegotiator *)");
    }
    BinarySink_put_byte(pn->output[0].binarysink_,'\x01');
    _Var3 = BinarySink_put_pstring
                      (pn->output[0].binarysink_,
                       (char *)(pn[-1].output[0].binarysink_[0].binarysink_)->write);
    if (!_Var3) {
      pcVar8 = dupstr("SOCKS 5 authentication cannot support usernames longer than 255 chars");
      pn->error = pcVar8;
      *(undefined4 *)&pbVar6->ch = 0;
      return;
    }
    _Var3 = BinarySink_put_pstring(pn->output[0].binarysink_,(char *)(pn[-1].itr)->vt);
    if (!_Var3) {
      pcVar8 = dupstr("SOCKS 5 authentication cannot support passwords longer than 255 chars");
      pn->error = pcVar8;
      *(undefined4 *)&pbVar6->ch = 0;
      return;
    }
    *(undefined4 *)&pbVar6->ch = 0x100;
  }
  else {
    if (iVar4 == 0x81) goto LAB_0016a529;
    if (iVar4 == 0xca) {
LAB_0016a7d5:
      iseat = interactor_announce(pn->itr);
      seat_get_userpass_input((SeatPromptResult *)local_80,iseat,*(prompts_t **)&pn[-1].done);
      if (local_80._0_4_ != SPRK_OK) {
        spr_01.errfn = spr.errfn;
        spr_01.kind = spr.kind;
        spr_01._4_4_ = spr._4_4_;
        spr_01.errdata_lit = spr.errdata_lit;
        spr_01.errdata_u = in_stack_fffffffffffffc98;
        spr_01._28_4_ = in_stack_fffffffffffffc9c;
        _Var3 = spr_is_abort(spr_01);
        if (!_Var3) {
          *(undefined4 *)&pbVar6->ch = 0xca;
          return;
        }
        spr_00._4_4_ = local_80._4_4_;
        spr_00.kind = local_80._0_4_;
        spr_00.errfn = (_func_void_SeatPromptResult_BinarySink_ptr *)spr._0_8_;
        spr_00.errdata_lit = (char *)spr.errfn;
        spr_00._24_8_ = spr.errdata_lit;
        proxy_spr_abort(pn,spr_00);
        *(undefined4 *)&pbVar6->ch = 0;
        return;
      }
      if (*(int *)&pn[-1].error != -1) {
        strbuf_clear((strbuf *)pn[-1].output[0].binarysink_[0].binarysink_);
        pBVar1 = pn[-1].output[0].binarysink_[0].binarysink_;
        pcVar8 = prompt_get_result_ref
                           (*(prompt_t **)
                             (*(long *)(*(long *)&pn[-1].done + 0x38) +
                             (long)*(int *)&pn[-1].error * 8));
        pVar9 = ptrlen_from_asciz(pcVar8);
        BinarySink_put_datapl(pBVar1 + 1,pVar9);
      }
      if (*(int *)((long)&pn[-1].error + 4) != -1) {
        strbuf_clear((strbuf *)pn[-1].itr);
        pIVar2 = pn[-1].itr;
        pcVar8 = prompt_get_result_ref
                           (*(prompt_t **)
                             (*(long *)(*(long *)&pn[-1].done + 0x38) +
                             (long)*(int *)((long)&pn[-1].error + 4) * 8));
        _auStack_a8 = ptrlen_from_asciz(pcVar8);
        BinarySink_put_datapl((BinarySink *)(pIVar2 + 1),_auStack_a8);
      }
      free_prompts(*(prompts_t **)&pn[-1].done);
      *(undefined8 *)&pn[-1].done = 0;
      goto LAB_0016a9bd;
    }
    if (iVar4 != 0x100) {
      if (iVar4 == 0x13f) goto LAB_0016ac36;
      if (iVar4 == 0x155) goto LAB_0016ad00;
      if (iVar4 == 0x159) {
        while( true ) {
          _Var3 = bufchain_try_fetch_consume
                            (pn->input,&pn[-4].itr,
                             (ulong)*(uint *)((long)&pn[-4].output[0].binarysink_[0].binarysink_ + 4
                                             ));
          if (!_Var3) {
            return;
          }
          if (*(int *)&pn[-4].output[0].binarysink_[0].binarysink_ == 0) break;
          if (*(int *)&pn[-4].output[0].binarysink_[0].binarysink_ == 3) {
            pVar9 = make_ptrlen(&pn[-4].itr,
                                (ulong)*(uint *)((long)&pn[-4].output[0].binarysink_[0].binarysink_
                                                + 4));
            password = ptrlen_from_strbuf((strbuf *)pn[-1].itr);
            sb = chap_response(pVar9,password);
            BinarySink_put_byte(pn->output[0].binarysink_,'\x01');
            BinarySink_put_byte(pn->output[0].binarysink_,'\x01');
            BinarySink_put_byte(pn->output[0].binarysink_,'\x04');
            BinarySink_put_byte(pn->output[0].binarysink_,(uchar)sb->len);
            _auStack_e8 = ptrlen_from_strbuf(sb);
            BinarySink_put_datapl(pn->output[0].binarysink_,_auStack_e8);
            strbuf_free(sb);
          }
          while (iVar4 = *(int *)((long)&pn[-4].output[0].binarysink_[0].writefmtv + 4),
                *(int *)((long)&pn[-4].output[0].binarysink_[0].writefmtv + 4) = iVar4 + -1,
                iVar4 == 0) {
LAB_0016ac2a:
            *(undefined4 *)&pbVar6->ch = 0x13f;
LAB_0016ac36:
            _Var3 = bufchain_try_fetch_consume(pn->input,(void *)((long)&response + 4),2);
            if (!_Var3) {
              return;
            }
            if (response._4_1_ != 1) {
              pcVar8 = dupprintf("SOCKS 5 CHAP reply had version number %d (expected %d)",
                                 (ulong)response._4_1_,1);
              pn->error = pcVar8;
              *(undefined4 *)&pbVar6->ch = 0;
              return;
            }
            *(uint *)((long)&pn[-4].output[0].binarysink_[0].writefmtv + 4) = (uint)response._5_1_;
            if (*(int *)((long)&pn[-4].output[0].binarysink_[0].writefmtv + 4) == 0) {
              pcVar8 = dupprintf("SOCKS 5 CHAP reply sent no attributes");
              pn->error = pcVar8;
              *(undefined4 *)&pbVar6->ch = 0;
              return;
            }
          }
          *(undefined4 *)&pbVar6->ch = 0x155;
LAB_0016ad00:
          _Var3 = bufchain_try_fetch_consume(pn->input,(void *)((long)&response + 2),2);
          if (!_Var3) {
            return;
          }
          *(uint *)&pn[-4].output[0].binarysink_[0].binarysink_ = (uint)response._2_1_;
          *(uint *)((long)&pn[-4].output[0].binarysink_[0].binarysink_ + 4) = (uint)response._3_1_;
          *(undefined4 *)&pbVar6->ch = 0x159;
        }
        if ((*(int *)((long)&pn[-4].output[0].binarysink_[0].binarysink_ + 4) != 1) ||
           (*(char *)&pn[-4].itr != '\0')) {
          pcVar8 = dupstr("SOCKS 5 CHAP authentication failed");
          pn->error = pcVar8;
          *(undefined4 *)&pbVar6->ch = 0;
          return;
        }
        goto LAB_0016af1c;
      }
      if (iVar4 == 0x1ad) {
        *(undefined4 *)&pbVar6->ch = 0x1bd;
LAB_0016b100:
        _Var3 = bufchain_try_fetch_consume(pn->input,&local_30c,4);
        if (!_Var3) {
          return;
        }
        if (local_30c != 5) {
          pcVar8 = dupprintf("SOCKS proxy returned unexpected reply version %d (expected %d)",
                             (ulong)local_30c,5);
          pn->error = pcVar8;
          *(undefined4 *)&pbVar6->ch = 0;
          return;
        }
        if (local_30b != 0) {
          uVar5 = (uint)local_30b;
          pcVar8 = socks5_response_text(local_30b);
          pcVar8 = dupprintf("SOCKS proxy failed to connect, error %d (%s)",(ulong)uVar5,pcVar8);
          pn->error = pcVar8;
          *(undefined4 *)&pbVar6->ch = 0;
          return;
        }
        if (local_309 == 1) {
          pn[-1].aborted = true;
          pn[-1].reconnect = false;
          *(undefined2 *)&pn[-1].field_0x52 = 0;
        }
        else {
          if (local_309 != 4) {
            if (local_309 != 3) {
              pcVar8 = dupprintf("SOCKS proxy response included unknown address type %d",
                                 (ulong)local_309);
              pn->error = pcVar8;
              *(undefined4 *)&pbVar6->ch = 0;
              return;
            }
            *(undefined4 *)&pbVar6->ch = 0x1da;
            goto LAB_0016b20d;
          }
          pn[-1].aborted = true;
          pn[-1].reconnect = false;
          *(undefined2 *)&pn[-1].field_0x52 = 0;
        }
        *(undefined4 *)&pbVar6->ch = 0x1e5;
      }
      else {
        if (iVar4 == 0x1bd) goto LAB_0016b100;
        if (iVar4 == 0x1da) {
LAB_0016b20d:
          _Var3 = bufchain_try_fetch_consume(pn->input,&local_30d,1);
          if (!_Var3) {
            return;
          }
          uVar5 = (uint)local_30d;
          pn[-1].aborted = (_Bool)(char)uVar5;
          pn[-1].reconnect = (_Bool)(char)(uVar5 >> 8);
          *(short *)&pn[-1].field_0x52 = (short)(uVar5 >> 0x10);
          goto LAB_0016b2ab;
        }
        if (iVar4 != 0x1e5) goto LAB_0016b2ab;
      }
      _Var3 = bufchain_try_consume(pn->input,(long)(*(int *)&pn[-1].aborted + 2));
      if (!_Var3) {
        return;
      }
      pn->done = true;
LAB_0016b2ab:
      *(undefined4 *)&pbVar6->ch = 0;
      return;
    }
  }
  _Var3 = bufchain_try_fetch_consume(pn->input,(void *)((long)&response + 6),2);
  if (!_Var3) {
    return;
  }
  if (response._6_1_ != 1) {
    pcVar8 = dupprintf("SOCKS 5 password reply had version number %d (expected %d)",
                       (ulong)response._6_1_,1);
    pn->error = pcVar8;
    *(undefined4 *)&pbVar6->ch = 0;
    return;
  }
  if (response._7_1_ != '\0') {
    pcVar8 = dupstr("SOCKS 5 server rejected our password");
    pn->error = pcVar8;
    *(undefined4 *)&pbVar6->ch = 0;
    return;
  }
LAB_0016af1c:
  BinarySink_put_byte(pn->output[0].binarysink_,'\x05');
  BinarySink_put_byte(pn->output[0].binarysink_,'\x01');
  BinarySink_put_byte(pn->output[0].binarysink_,'\0');
  iVar4 = sk_addrtype(pn->ps->remote_addr);
  if (iVar4 == 1) {
    BinarySink_put_byte(pn->output[0].binarysink_,'\x01');
    sk_addrcopy(pn->ps->remote_addr,local_ec);
    BinarySink_put_data(pn->output[0].binarysink_,local_ec,4);
  }
  else if (iVar4 == 2) {
    BinarySink_put_byte(pn->output[0].binarysink_,'\x04');
    sk_addrcopy(pn->ps->remote_addr,hostname + 0x1f8);
    BinarySink_put_data(pn->output[0].binarysink_,hostname + 0x1f8,0x10);
  }
  else {
    if (iVar4 != 4) {
      __assert_fail("false && \"Unexpected addrtype in SOCKS 5 proxy\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/socks5.c"
                    ,0x1a9,"void proxy_socks5_process_queue(ProxyNegotiator *)");
    }
    BinarySink_put_byte(pn->output[0].binarysink_,'\x03');
    sk_getaddr(pn->ps->remote_addr,local_308,0x200);
    _Var3 = BinarySink_put_pstring(pn->output[0].binarysink_,local_308);
    if (!_Var3) {
      pcVar8 = dupstr("SOCKS 5 cannot support host names longer than 255 chars");
      pn->error = pcVar8;
      *(undefined4 *)&pbVar6->ch = 0;
      return;
    }
  }
  BinarySink_put_uint16(pn->output[0].binarysink_,(long)pn->ps->remote_port);
  *(undefined4 *)&pbVar6->ch = 0x1ad;
  return;
}

Assistant:

static void proxy_socks5_process_queue(ProxyNegotiator *pn)
{
    Socks5ProxyNegotiator *s = container_of(pn, Socks5ProxyNegotiator, pn);

    crBegin(s->crLine);

    /*
     * SOCKS 5 initial client packet:
     *
     *   byte      version
     *   byte      number of available auth methods
     *   byte[]    that many bytes indicating auth types
     */

    put_byte(pn->output, SOCKS5_REQUEST_VERSION);

    strbuf_clear(s->auth_methods_offered);

    /*
     * We have two basic kinds of authentication to offer: none at
     * all, and password-based systems (whether the password is sent
     * in cleartext or proved via CHAP).
     *
     * We always offer 'none' as an option. We offer 'password' if we
     * either have a username and password already from the Conf, or
     * we have a Seat available to ask for them interactively. If
     * neither, we don't offer those options in the first place.
     */
    put_byte(s->auth_methods_offered, SOCKS5_AUTH_NONE);

    put_dataz(s->username, conf_get_str(pn->ps->conf, CONF_proxy_username));
    put_dataz(s->password, conf_get_str(pn->ps->conf, CONF_proxy_password));
    if (pn->itr || (s->username->len && s->password->len)) {
        if (socks5_chap_available)
            put_byte(s->auth_methods_offered, SOCKS5_AUTH_CHAP);

        put_byte(s->auth_methods_offered, SOCKS5_AUTH_PASSWORD);
    }

    put_byte(pn->output, s->auth_methods_offered->len);
    put_datapl(pn->output, ptrlen_from_strbuf(s->auth_methods_offered));

    crReturnV;

    /*
     * SOCKS 5 initial server packet:
     *
     *   byte      version
     *   byte      selected auth method, or SOCKS5_AUTH_REJECTED
     */
    {
        unsigned char data[2];
        crMaybeWaitUntilV(bufchain_try_fetch_consume(pn->input, data, 2));

        if (data[0] != SOCKS5_REPLY_VERSION) {
            pn->error = dupprintf("SOCKS proxy returned unexpected "
                                  "reply version %d (expected %d)",
                                  (int)data[0], SOCKS5_REPLY_VERSION);
            crStopV;
        }

        if (data[1] == SOCKS5_AUTH_REJECTED) {
            pn->error = dupstr("SOCKS server rejected every authentication "
                               "method we offered");
            crStopV;
        }

        {
            bool found = false;
            for (size_t i = 0; i < s->auth_methods_offered->len; i++)
                if (s->auth_methods_offered->u[i] == data[1]) {
                    found = true;
                    break;
                }

            if (!found) {
                pn->error = dupprintf("SOCKS server asked for auth method %d "
                                      "(%s), which we did not offer",
                                      (int)data[1], socks5_auth_name(data[1]));
                crStopV;
            }
        }

        s->auth_method = data[1];
    }

    /*
     * The 'none' auth option requires no further negotiation. If that
     * was the one we selected, go straight to making the connection.
     */
    if (s->auth_method == SOCKS5_AUTH_NONE)
        goto authenticated;

    /*
     * Otherwise, we're going to need a username and password, so this
     * is the moment to stop and ask for one if we don't already have
     * them.
     */
    if (pn->itr && (!s->username->len || !s->password->len)) {
        s->prompts = proxy_new_prompts(pn->ps);
        s->prompts->to_server = true;
        s->prompts->from_server = false;
        s->prompts->name = dupstr("SOCKS proxy authentication");
        if (!s->username->len) {
            s->username_prompt_index = s->prompts->n_prompts;
            add_prompt(s->prompts, dupstr("Proxy username: "), true);
        } else {
            s->username_prompt_index = -1;
        }
        if (!s->password->len) {
            s->password_prompt_index = s->prompts->n_prompts;
            add_prompt(s->prompts, dupstr("Proxy password: "), false);
        } else {
            s->password_prompt_index = -1;
        }

        while (true) {
            SeatPromptResult spr = seat_get_userpass_input(
                interactor_announce(pn->itr), s->prompts);
            if (spr.kind == SPRK_OK) {
                break;
            } else if (spr_is_abort(spr)) {
                proxy_spr_abort(pn, spr);
                crStopV;
            }
            crReturnV;
        }

        if (s->username_prompt_index != -1) {
            strbuf_clear(s->username);
            put_dataz(s->username,
                      prompt_get_result_ref(
                          s->prompts->prompts[s->username_prompt_index]));
        }

        if (s->password_prompt_index != -1) {
            strbuf_clear(s->password);
            put_dataz(s->password,
                      prompt_get_result_ref(
                          s->prompts->prompts[s->password_prompt_index]));
        }

        free_prompts(s->prompts);
        s->prompts = NULL;
    }

    /*
     * Now process the different auth methods that will use that
     * username and password. Note we can't do this using the natural
     * idiom of a switch statement, because there are crReturns inside
     * some cases.
     */
    if (s->auth_method == SOCKS5_AUTH_PASSWORD) {
        /*
         * SOCKS 5 password auth packet:
         *
         *   byte      version
         *   pstring   username
         *   pstring   password
         */
        put_byte(pn->output, SOCKS5_AUTH_PASSWORD_VERSION);
        if (!put_pstring(pn->output, s->username->s)) {
            pn->error = dupstr("SOCKS 5 authentication cannot support "
                               "usernames longer than 255 chars");
            crStopV;
        }
        if (!put_pstring(pn->output, s->password->s)) {
            pn->error = dupstr("SOCKS 5 authentication cannot support "
                               "passwords longer than 255 chars");
            crStopV;
        }

        /*
         * SOCKS 5 password reply packet:
         *
         *   byte      version
         *   byte      0 for success, >0 for failure
         */
        unsigned char data[2];
        crMaybeWaitUntilV(bufchain_try_fetch_consume(pn->input, data, 2));

        if (data[0] != SOCKS5_AUTH_PASSWORD_VERSION) {
            pn->error = dupprintf(
                "SOCKS 5 password reply had version number %d (expected "
                "%d)", (int)data[0], SOCKS5_AUTH_PASSWORD_VERSION);
            crStopV;
        }

        if (data[1] != 0) {
            pn->error = dupstr("SOCKS 5 server rejected our password");
            crStopV;
        }
    } else if (s->auth_method == SOCKS5_AUTH_CHAP) {
        assert(socks5_chap_available);

        /*
         * All CHAP packets, in both directions, have the same
         * overall format:
         *
         *   byte      version
         *   byte      number of attributes
         *
         * and then for each attribute:
         *
         *   byte      attribute type
         *   byte      length
         *   byte[]    that many bytes of payload
         *
         * In the initial outgoing packet we send two attributes:
         * the list of supported algorithm names, and the
         * username.
         *
         * (It's possible that we ought to delay sending the
         * username until the second packet, in case the proxy
         * sent back an attribute indicating which character set
         * it would like us to use.)
         */
        put_byte(pn->output, SOCKS5_AUTH_CHAP_VERSION);
        put_byte(pn->output, 2);   /* number of attributes */

        put_byte(pn->output, SOCKS5_AUTH_CHAP_ATTR_ALGLIST);
        put_byte(pn->output, 1);   /* string length */
        put_byte(pn->output, SOCKS5_AUTH_CHAP_ALG_HMACMD5);

        /* Second attribute: username */
        {
            put_byte(pn->output, SOCKS5_AUTH_CHAP_ATTR_USERNAME);
            if (!put_pstring(pn->output, s->username->s)) {
                pn->error = dupstr(
                    "SOCKS 5 CHAP authentication cannot support "
                    "usernames longer than 255 chars");
                crStopV;
            }
        }

        while (true) {
            /*
             * Process a CHAP response packet, which has the same
             * overall format as the outgoing packet shown above.
             */
            unsigned char data[2];
            crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                  pn->input, data, 2));
            if (data[0] != SOCKS5_AUTH_CHAP_VERSION) {
                pn->error = dupprintf(
                    "SOCKS 5 CHAP reply had version number %d (expected "
                    "%d)", (int)data[0], SOCKS5_AUTH_CHAP_VERSION);
                crStopV;
            }

            s->n_chap_attrs = data[1];
            if (s->n_chap_attrs == 0) {
                /*
                 * If we receive a CHAP packet containing no
                 * attributes, then we have nothing we didn't have
                 * before, and can't make further progress.
                 */
                pn->error = dupprintf(
                    "SOCKS 5 CHAP reply sent no attributes");
                crStopV;
            }
            while (s->n_chap_attrs-- > 0) {
                unsigned char data[2];
                crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                      pn->input, data, 2));
                s->chap_attr = data[0];
                s->chap_attr_len = data[1];
                crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                      pn->input, s->chap_buf, s->chap_attr_len));

                if (s->chap_attr == SOCKS5_AUTH_CHAP_ATTR_STATUS) {
                    if (s->chap_attr_len == 1 && s->chap_buf[0] == 0) {
                        /* Status 0 means success: we are authenticated! */
                        goto authenticated;
                    } else {
                        pn->error = dupstr(
                            "SOCKS 5 CHAP authentication failed");
                        crStopV;
                    }
                } else if (s->chap_attr==SOCKS5_AUTH_CHAP_ATTR_CHALLENGE) {
                    /* The CHAP challenge string. Send the response */
                    strbuf *response = chap_response(
                        make_ptrlen(s->chap_buf, s->chap_attr_len),
                        ptrlen_from_strbuf(s->password));

                    put_byte(pn->output, SOCKS5_AUTH_CHAP_VERSION);
                    put_byte(pn->output, 1); /* number of attributes */
                    put_byte(pn->output, SOCKS5_AUTH_CHAP_ATTR_RESPONSE);
                    put_byte(pn->output, response->len);
                    put_datapl(pn->output, ptrlen_from_strbuf(response));

                    strbuf_free(response);
                } else {
                    /* ignore all other attributes */
                }
            }
        }
    } else {
        unreachable("bad auth method in SOCKS 5 negotiation");
    }

  authenticated:

    /*
     * SOCKS 5 connection command:
     *
     *   byte      version
     *   byte      command
     *   byte      reserved (send as zero)
     *   byte      address type
     *   byte[]    address, with variable size (see below)
     *   uint16    port
     */
    put_byte(pn->output, SOCKS5_REPLY_VERSION);
    put_byte(pn->output, SOCKS_CMD_CONNECT);
    put_byte(pn->output, 0);   /* reserved byte */

    switch (sk_addrtype(pn->ps->remote_addr)) {
      case ADDRTYPE_IPV4: {
        /* IPv4: address is 4 raw bytes */
        put_byte(pn->output, SOCKS5_ADDR_IPV4);
        char buf[4];
        sk_addrcopy(pn->ps->remote_addr, buf);
        put_data(pn->output, buf, sizeof(buf));
        break;
      }
      case ADDRTYPE_IPV6: {
        /* IPv6: address is 16 raw bytes */
        put_byte(pn->output, SOCKS5_ADDR_IPV6);
        char buf[16];
        sk_addrcopy(pn->ps->remote_addr, buf);
        put_data(pn->output, buf, sizeof(buf));
        break;
      }
      case ADDRTYPE_NAME: {
        /* Hostname: address is a pstring (Pascal-style string,
         * unterminated but with a one-byte prefix length) */
        put_byte(pn->output, SOCKS5_ADDR_HOSTNAME);
        char hostname[512];
        sk_getaddr(pn->ps->remote_addr, hostname, lenof(hostname));
        if (!put_pstring(pn->output, hostname)) {
            pn->error = dupstr(
                "SOCKS 5 cannot support host names longer than 255 chars");
            crStopV;
        }
        break;
      }
      default:
        unreachable("Unexpected addrtype in SOCKS 5 proxy");
    }

    put_uint16(pn->output, pn->ps->remote_port);
    crReturnV;

    /*
     * SOCKS 5 connection response:
     *
     *   byte      version
     *   byte      status
     *   byte      reserved
     *   byte      address type
     *   byte[]    address bound to (same formats as in connection request)
     *   uint16    port
     *
     * We read the first four bytes and then decide what to do next.
     */
    {
        unsigned char data[4];
        crMaybeWaitUntilV(bufchain_try_fetch_consume(pn->input, data, 4));

        if (data[0] != SOCKS5_REPLY_VERSION) {
            pn->error = dupprintf("SOCKS proxy returned unexpected "
                                  "reply version %d (expected %d)",
                                  (int)data[0], SOCKS5_REPLY_VERSION);
            crStopV;
        }

        if (data[1] != SOCKS5_RESP_SUCCESS) {
            pn->error = dupprintf("SOCKS proxy failed to connect, error %d "
                                  "(%s)", (int)data[1],
                                  socks5_response_text(data[1]));
            crStopV;
        }

        /*
         * Process each address type to find out the size of the rest
         * of the packet. Note we can't do this using the natural
         * idiom of a switch statement, because there are crReturns
         * inside some cases.
         */
        if (data[3] == SOCKS5_ADDR_IPV4) {
            s->response_addr_length = 4;
        } else if (data[3] == SOCKS5_ADDR_IPV6) {
            s->response_addr_length = 16;
        } else if (data[3] == SOCKS5_ADDR_HOSTNAME) {
            /* Read the hostname length byte to find out how much to read */
            unsigned char len; 
            crMaybeWaitUntilV(bufchain_try_fetch_consume(pn->input, &len, 1));
            s->response_addr_length = len;
            break;
        } else {
            pn->error = dupprintf("SOCKS proxy response included unknown "
                                  "address type %d", (int)data[3]);
            crStopV;
        }

        /* Read and ignore the address and port fields */
        crMaybeWaitUntilV(bufchain_try_consume(
                              pn->input, s->response_addr_length + 2));
    }

    /* And we're done! */
    pn->done = true;
    crFinishV;
}